

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear(MessageGenerator *this,Printer *p)

{
  pointer *pppFVar1;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor FVar2;
  FieldDescriptor FVar3;
  iterator __position;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  ChunkIterator CVar4;
  FieldChunk *pFVar5;
  MessageGenerator *this_00;
  Options *pOVar6;
  bool bVar7;
  bool bVar8;
  undefined1 uVar9;
  int iVar10;
  int iVar11;
  uint32_t uVar12;
  uint uVar13;
  ChunkIterator CVar14;
  long *plVar15;
  FieldGenerator *pFVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  value_type pOVar18;
  string *psVar19;
  Options *in_RCX;
  FieldChunk *pFVar20;
  ulong uVar21;
  FieldDescriptor **field;
  pointer ppFVar22;
  pointer ppFVar23;
  int iVar24;
  pointer pFVar25;
  FieldDescriptor *pFVar26;
  FieldDescriptor *pFVar27;
  FieldGeneratorTable *pFVar28;
  ChunkIterator it;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  Hex hex;
  int cached_has_word_index;
  FieldDescriptor *field_1;
  Formatter format;
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  chunks;
  string chunk_mask_str;
  int local_200;
  char local_1f9;
  ulong local_1f8;
  MessageGenerator *local_1f0;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  Options *local_1c8;
  uint local_1bc;
  undefined1 local_1b8 [44];
  int local_18c;
  FieldGeneratorTable *local_188;
  FieldChunk *local_180;
  ChunkIterator local_178;
  vector<int,_std::allocator<int>_> *local_170;
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  local_168;
  string local_148;
  Sub local_128;
  Printer *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ulong local_48;
  long local_40;
  code *local_38;
  
  local_1f0 = this;
  SimpleBaseClass_abi_cxx11_
            (&local_128.key_,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
    operator_delete(local_128.key_._M_dataplus._M_p,local_128.key_.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_128.key_._M_string_length != 0) {
    return;
  }
  vars = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(local_1b8 + 8);
  local_1b8._8_8_ = 0;
  local_1b8._16_8_ = 0;
  local_1b8._24_8_ = google::protobuf::internal::TypeCardToString_abi_cxx11_;
  format_00._M_str =
       "PROTOBUF_NOINLINE void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
  ;
  format_00._M_len = 0x6b;
  local_1b8._0_8_ = p;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (p,(Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),vars,format_00);
  *(long *)(local_1b8._0_8_ + 0x68) =
       *(long *)(local_1b8._0_8_ + 0x68) + *(long *)(local_1b8._0_8_ + 0x58);
  format_01._M_str = "$pbi$::TSanWrite(&_impl_);\n";
  format_01._M_len = 0x1b;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_1b8._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),vars,format_01);
  format_02._M_str =
       "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
  ;
  format_02._M_len = 0x77;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_1b8._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),vars,format_02);
  if (0 < *(int *)(local_1f0->descriptor_ + 0x88)) {
    format_03._M_str = "$extensions$.Clear();\n";
    format_03._M_len = 0x16;
    io::Printer::
    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_1b8._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),vars,format_03);
  }
  ppFVar22 = (local_1f0->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar23 = (local_1f0->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar22 != ppFVar23) {
    iVar24 = 0;
    do {
      bVar7 = CanClearByZeroing(*ppFVar22);
      if (bVar7) {
        iVar10 = EstimateAlignmentSize(*ppFVar22);
        iVar24 = iVar24 + iVar10;
      }
      ppFVar22 = ppFVar22 + 1;
    } while (ppFVar22 != ppFVar23);
    pFVar28 = (FieldGeneratorTable *)
              (local_1f0->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_188 = (FieldGeneratorTable *)
                (local_1f0->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_168.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_start = (FieldChunk *)0x0;
    local_168.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_finish = (FieldChunk *)0x0;
    local_168.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pFVar28 != local_188) {
      local_1f8 = 0;
      pFVar25 = (FieldChunk *)0x0;
      local_1c8 = &this->options_;
      local_18c = iVar24;
      local_70 = p;
      do {
        this_00 = local_1f0;
        pFVar26 = (FieldDescriptor *)pFVar28->descriptor_;
        local_1e8._0_8_ = pFVar26;
        if (local_168.
            super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
            ._M_impl.super__Vector_impl_data._M_start == pFVar25) {
LAB_001fefc1:
          uVar9 = google::protobuf::internal::cpp::HasHasbit((FieldDescriptor *)local_1e8._0_8_);
          pOVar6 = local_1c8;
          local_128.key_._M_dataplus._M_p._0_1_ = uVar9;
          bVar7 = IsRarelyPresent((FieldDescriptor *)local_1e8._0_8_,local_1c8);
          local_148._M_dataplus._M_p._0_1_ = bVar7;
          local_68._M_dataplus._M_p._0_1_ = ShouldSplit((FieldDescriptor *)local_1e8._0_8_,pOVar6);
          std::
          vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>
          ::emplace_back<bool,bool,bool>
                    ((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>
                      *)&local_168,(bool *)&local_128,(bool *)&local_148,(bool *)&local_68);
          pFVar25 = local_168.
                    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          pFVar27 = pFVar25[-1].fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1];
          iVar10 = HasBitIndex(local_1f0,pFVar27);
          p = local_70;
          iVar24 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar24 = iVar10;
          }
          iVar24 = iVar24 >> 3;
          if (iVar10 == -1) {
            iVar24 = -1;
          }
          iVar11 = HasBitIndex(this_00,pFVar26);
          iVar10 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar10 = iVar11;
          }
          iVar10 = iVar10 >> 3;
          if (iVar11 == -1) {
            iVar10 = -1;
          }
          if (iVar24 != iVar10) goto LAB_001fefb3;
          FVar2 = pFVar27[1];
          bVar7 = (bool)(((byte)FVar2 & 0x20) >> 5);
          if (0xbf < (byte)FVar2 != bVar7) {
            psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < (byte)FVar2,
                                 "is_repeated_ == label() == LABEL_REPEATED");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_128,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
LAB_001ffb70:
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_128);
          }
          FVar3 = pFVar26[1];
          bVar7 = (bool)(((byte)FVar3 & 0x20) >> 5);
          if (0xbf < (byte)FVar3 != bVar7) {
            psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < (byte)FVar3,
                                 "is_repeated_ == label() == LABEL_REPEATED");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_128,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
            goto LAB_001ffb70;
          }
          if ((((byte)FVar2 ^ (byte)FVar3) & 0x20) != 0) {
LAB_001fefb3:
            local_1f8 = 0;
            goto LAB_001fefc1;
          }
          bVar7 = IsLikelyPresent(pFVar27,local_1c8);
          bVar8 = IsLikelyPresent(pFVar26,local_1c8);
          if (bVar7 != bVar8) goto LAB_001fefb3;
          bVar7 = ShouldSplit(pFVar27,local_1c8);
          bVar8 = ShouldSplit(pFVar26,local_1c8);
          if (bVar7 != bVar8) goto LAB_001fefb3;
          bVar7 = CanClearByZeroing(pFVar27);
          bVar8 = CanClearByZeroing(pFVar26);
          uVar13 = (int)local_1f8 + 1;
          if (bVar7 == bVar8) {
            local_1f8 = (ulong)uVar13;
          }
          else {
            bVar7 = CanClearByZeroing(pFVar27);
            bVar8 = (int)local_1f8 != 0;
            local_1f8 = (ulong)uVar13;
            if (!bVar7 || bVar8 && local_18c < 5) goto LAB_001fefb3;
          }
        }
        __position._M_current =
             pFVar25[-1].fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            pFVar25[-1].fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)&pFVar25[-1].fields,__position,(FieldDescriptor **)local_1e8);
        }
        else {
          *__position._M_current = (FieldDescriptor *)local_1e8._0_8_;
          pppFVar1 = &pFVar25[-1].fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
        pFVar28 = (FieldGeneratorTable *)&pFVar28->fields_;
      } while (pFVar28 != local_188);
      local_200 = -1;
      local_180 = local_168.
                  super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_168.
          super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_168.
          super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_170 = &local_1f0->has_bit_indices_;
        local_188 = &local_1f0->field_generators_;
        it._M_current =
             local_168.
             super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
             ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar24 = local_200;
          CVar14._M_current = it._M_current;
          CVar4._M_current = it._M_current;
          do {
            pFVar20 = CVar4._M_current + 1;
            local_178._M_current = local_180;
            if (((pFVar20 == local_180) ||
                (CVar14._M_current = CVar14._M_current + 1, local_178._M_current = CVar14._M_current
                , (it._M_current)->has_hasbit != pFVar20->has_hasbit)) ||
               ((it._M_current)->is_rarely_present != CVar4._M_current[1].is_rarely_present)) break;
            pFVar5 = CVar4._M_current + 1;
            local_178._M_current = pFVar20;
            CVar4._M_current = pFVar20;
          } while ((it._M_current)->should_split == pFVar5->should_split);
          local_128.key_._M_dataplus._M_p = (pointer)&local_128.key_.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
          local_1f9 = anon_unknown_0::MaybeEmitHaswordsCheck
                                (it,local_178,local_1c8,local_170,iVar24,&local_128.key_,p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
            operator_delete(local_128.key_._M_dataplus._M_p,
                            local_128.key_.field_2._M_allocated_capacity + 1);
          }
          CVar4._M_current = local_178._M_current;
          if ((((it._M_current)->fields).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               ((it._M_current)->fields).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             ((it._M_current)->should_split != true)) {
            uVar21 = 0;
          }
          else {
            format_04._M_str = "if (!IsSplitMessageDefault()) {\n";
            format_04._M_len = 0x20;
            io::Printer::
            FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                      ((Printer *)local_1b8._0_8_,
                       (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )ZEXT816(0),
                       (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_1b8 + 8),format_04);
            *(long *)(local_1b8._0_8_ + 0x68) =
                 *(long *)(local_1b8._0_8_ + 0x68) + *(long *)(local_1b8._0_8_ + 0x58);
            uVar21 = CONCAT71((int7)((ulong)*(long *)(local_1b8._0_8_ + 0x58) >> 8),1);
          }
          if (it._M_current != CVar4._M_current) {
            local_1bc = (uint)uVar21;
            do {
              if (SUB81(uVar21,0) != (it._M_current)->should_split) {
                psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                    (SUB81(uVar21,0),(it._M_current)->should_split,
                                     "has_default_split_check == chunk_is_split");
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_128,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                           ,0xdb2,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
                goto LAB_001ffb70;
              }
              ppFVar23 = ((it._M_current)->fields).
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppFVar22 = ((it._M_current)->fields).
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              if (ppFVar23 == ppFVar22) {
                pFVar26 = (FieldDescriptor *)0x0;
                pFVar27 = (FieldDescriptor *)0x0;
              }
              else {
                pFVar27 = (FieldDescriptor *)0x0;
                pFVar26 = (FieldDescriptor *)0x0;
                bVar7 = false;
                do {
                  bVar8 = CanClearByZeroing(*ppFVar23);
                  if (bVar8) {
                    if (bVar7) {
                      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)&local_128,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                                 ,0xdba,0x12,"!saw_non_zero_init");
                      goto LAB_001ffb70;
                    }
                    pFVar26 = *ppFVar23;
                    if (pFVar27 == (FieldDescriptor *)0x0) {
                      pFVar27 = pFVar26;
                    }
                  }
                  bVar7 = !bVar8;
                  ppFVar23 = ppFVar23 + 1;
                } while (ppFVar23 != ppFVar22);
                ppFVar23 = ((it._M_current)->fields).
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                p = local_70;
              }
              iVar24 = HasBitIndex(local_1f0,*ppFVar23);
              if (iVar24 == -1) {
LAB_001ff2ef:
                local_1f8 = local_1f8 & 0xffffffff00000000;
              }
              else {
                ppFVar22 = ((it._M_current)->fields).
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                uVar21 = (long)ppFVar22 - (long)ppFVar23;
                if (uVar21 < 9) goto LAB_001ff2ef;
                bVar7 = IsLikelyPresent(ppFVar22[-1],local_1c8);
                if ((!bVar7) &&
                   ((fields = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               *)((it._M_current)->fields).
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                    pFVar26 !=
                    (FieldDescriptor *)
                    fields[-1].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage || (4 < local_18c)))) {
                  uVar12 = anon_unknown_0::GenChunkMask
                                     ((anon_unknown_0 *)
                                      ((it._M_current)->fields).
                                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,fields,local_170);
                  hex.value = local_48 & 0xffffffffffff0000 | 0x3008;
                  local_1e8._0_8_ = local_1e8 + 0x10;
                  local_1d8._M_allocated_capacity = 0;
                  local_1d8._8_8_ = 0;
                  local_1e8._8_8_ = (Descriptor *)0x0;
                  hex.width = (char)uVar21;
                  hex.fill = (char)(uVar21 >> 8);
                  hex._10_6_ = (int6)(uVar21 >> 0x10);
                  local_48 = hex.value;
                  absl::lts_20240722::
                  AbslStringify<absl::lts_20240722::strings_internal::StringifySink>
                            ((lts_20240722 *)local_1e8,(StringifySink *)(ulong)uVar12,hex);
                  local_128.key_._M_dataplus._M_p = (pointer)&local_128.key_.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_128,local_1e8._0_8_,
                             (Descriptor *)(local_1e8._8_8_ + local_1e8._0_8_));
                  if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
                    operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
                  }
                  iVar24 = local_200;
                  iVar10 = 0;
                  uVar13 = uVar12;
                  if (uVar12 != 0) {
                    do {
                      iVar10 = iVar10 + (uVar13 & 1);
                      bVar7 = 1 < uVar13;
                      uVar13 = uVar13 >> 1;
                    } while (bVar7);
                    if (1 < iVar10) {
                      uVar13 = 0;
                      do {
                        uVar13 = uVar13 + (uVar12 & 1);
                        bVar7 = 1 < uVar12;
                        uVar12 = uVar12 >> 1;
                      } while (bVar7);
                      if (8 < (int)uVar13) {
                        psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                            (8,(ulong)uVar13,"8 >= popcnt(chunk_mask)");
                        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                                  ((LogMessageFatal *)local_1e8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                                   ,0xdd6,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
                        goto LAB_001ffc4e;
                      }
                      iVar11 = HasBitIndex(local_1f0,
                                           *((it._M_current)->fields).
                                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                      iVar10 = iVar11 + 0x1f;
                      if (-1 < iVar11) {
                        iVar10 = iVar11;
                      }
                      iVar10 = iVar10 >> 5;
                      if (iVar11 == -1) {
                        iVar10 = -1;
                      }
                      if (iVar24 != iVar10) {
                        local_200 = iVar10;
                        Formatter::operator()
                                  ((Formatter *)local_1b8,"cached_has_bits = $has_bits$[$1$];\n",
                                   &local_200);
                      }
                      Formatter::operator()
                                ((Formatter *)local_1b8,"if (cached_has_bits & 0x$1$u) {\n",
                                 &local_128.key_);
                      *(long *)(local_1b8._0_8_ + 0x68) =
                           *(long *)(local_1b8._0_8_ + 0x68) + *(long *)(local_1b8._0_8_ + 0x58);
                      paVar17 = &local_128.key_.field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_128.key_._M_dataplus._M_p != paVar17) {
                        operator_delete(local_128.key_._M_dataplus._M_p,
                                        local_128.key_.field_2._M_allocated_capacity + 1);
                        paVar17 = extraout_RAX;
                      }
                      local_1f8 = CONCAT44(local_1f8._4_4_,
                                           (int)CONCAT71((int7)((ulong)paVar17 >> 8),1));
                      goto LAB_001ff2ff;
                    }
                  }
                  psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                      (2,(long)iVar10,"2 <= popcnt(chunk_mask)");
                  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)local_1e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                             ,0xdd5,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
LAB_001ffc4e:
                  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                            ((LogMessageFatal *)local_1e8);
                }
                local_1f8 = local_1f8 & 0xffffffff00000000;
              }
LAB_001ff2ff:
              if (pFVar27 != (FieldDescriptor *)0x0) {
                if (pFVar27 == pFVar26) {
                  pFVar16 = FieldGeneratorTable::get(local_188,pFVar27);
                  FieldGenerator::GenerateMessageClearingCode(pFVar16,p);
                }
                else {
                  bVar7 = ShouldSplit(pFVar27,local_1c8);
                  if (local_1bc._0_1_ != bVar7) {
                    psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                        (local_1bc._0_1_,bVar7,
                                         "chunk_is_split == ShouldSplit(memset_start, options_)");
                    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)&local_128,
                               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                               ,0xde5,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
                    goto LAB_001ffb70;
                  }
                  bVar7 = ShouldSplit(pFVar26,local_1c8);
                  bVar8 = SUB41(local_1bc,0);
                  if (bVar8 != bVar7) {
                    psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                        (bVar8,bVar7,
                                         "chunk_is_split == ShouldSplit(memset_end, options_)");
                    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)&local_128,
                               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                               ,0xde6,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
                    goto LAB_001ffb70;
                  }
                  uVar13 = local_1bc & 0xff;
                  FieldMemberName_abi_cxx11_
                            (&local_128.key_,(cpp *)pFVar27,(FieldDescriptor *)(ulong)bVar8,bVar8);
                  FieldMemberName_abi_cxx11_
                            ((string *)local_1e8,(cpp *)pFVar26,(FieldDescriptor *)(ulong)uVar13,
                             bVar8);
                  Formatter::operator()
                            ((Formatter *)local_1b8,
                             "::memset(&$1$, 0, static_cast<::size_t>(\n    reinterpret_cast<char*>(&$2$) -\n    reinterpret_cast<char*>(&$1$)) + sizeof($2$));\n"
                             ,&local_128.key_,(string *)local_1e8);
                  if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
                    operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
                    operator_delete(local_128.key_._M_dataplus._M_p,
                                    local_128.key_.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              ppFVar23 = ((it._M_current)->fields).
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              for (ppFVar22 = ((it._M_current)->fields).
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppFVar22 != ppFVar23;
                  ppFVar22 = ppFVar22 + 1) {
                bVar7 = CanClearByZeroing(*ppFVar22);
                if (!bVar7) {
                  pFVar26 = *ppFVar22;
                  iVar24 = HasBitIndex(local_1f0,pFVar26);
                  if ((iVar24 == -1) ||
                     (1 < *(int *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                                  (ulong)(byte)pFVar26[2] * 4) - 9U)) {
                    bVar7 = false;
                  }
                  else {
                    if (*(char *)(*(long *)(pFVar26 + 0x38) + 0x8c) == '\0') {
                      if (((byte)pFVar26[1] & 8) == 0) {
                        plVar15 = (long *)(*(long *)(pFVar26 + 0x20) + 0x38);
                      }
                      else if (*(long *)(pFVar26 + 0x28) == 0) {
                        plVar15 = (long *)(*(long *)(pFVar26 + 0x10) + 0x78);
                      }
                      else {
                        plVar15 = (long *)(*(long *)(pFVar26 + 0x28) + 0x60);
                      }
                      iVar24 = (local_170->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start
                               [(int)((ulong)((long)pFVar26 - *plVar15) >> 3) * -0x45d1745d];
                      iVar10 = iVar24 + 0x1f;
                      if (-1 < iVar24) {
                        iVar10 = iVar24;
                      }
                      if (local_200 != iVar10 >> 5) {
                        local_1e8._0_8_ = local_1e8 + 0x10;
                        local_1e8._8_8_ = &DAT_00000005;
                        local_1d8._M_allocated_capacity._0_6_ = 0x7865646e69;
                        local_200 = iVar10 >> 5;
                        io::Printer::Sub::Sub<int&>(&local_128,(string *)local_1e8,&local_200);
                        google::protobuf::io::Printer::Emit
                                  (p,&local_128,1,0x46,
                                   "\n                cached_has_bits = $has_bits$[$index$];\n              "
                                  );
                        if (local_128.annotation_.
                            super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                            ._M_payload.
                            super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                            .
                            super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                            ._M_engaged == true) {
                          std::
                          _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                          _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                      *)&local_128.annotation_);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_128.value_.consume_after._M_dataplus._M_p !=
                            &local_128.value_.consume_after.field_2) {
                          operator_delete(local_128.value_.consume_after._M_dataplus._M_p,
                                          local_128.value_.consume_after.field_2.
                                          _M_allocated_capacity + 1);
                        }
                        (*std::__detail::__variant::
                          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                          ::_S_vtable._M_arr
                          [local_128.value_.value.
                           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                           .
                           super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                           .
                           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                           .
                           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                           .
                           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                           .
                           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                           ._M_index]._M_data)
                                  ((anon_class_1_0_00000001 *)&local_68,&local_128.value_.value);
                        local_128.value_.value.
                        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                        .
                        super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                        .
                        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                        .
                        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                        .
                        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                        .
                        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                        ._M_index = 0xff;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
                          operator_delete(local_128.key_._M_dataplus._M_p,
                                          local_128.key_.field_2._M_allocated_capacity + 1);
                        }
                        if ((FieldDescriptor *)local_1e8._0_8_ !=
                            (FieldDescriptor *)(local_1e8 + 0x10)) {
                          operator_delete((void *)local_1e8._0_8_,
                                          local_1d8._M_allocated_capacity + 1);
                        }
                      }
                      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                      local_148.field_2._M_allocated_capacity._0_4_ = 0x6b73616d;
                      local_40 = 1L << ((byte)iVar24 & 0x1f);
                      local_148._M_string_length = 4;
                      local_148.field_2._M_allocated_capacity._4_4_ =
                           local_148.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                      local_38 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                                 Dispatch<unsigned_int>;
                      absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                                (&local_68,"0x%08xu",7,&local_40,1);
                      io::Printer::Sub::Sub<std::__cxx11::string>(&local_128,&local_148,&local_68);
                      google::protobuf::io::Printer::Emit
                                (p,&local_128,1,0x3b,
                                 "\n              if (cached_has_bits & $mask$) {\n            ");
                      if (local_128.annotation_.
                          super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                          ._M_payload.
                          super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                          .
                          super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                          ._M_engaged == true) {
                        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                        ::_M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                      *)&local_128.annotation_);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_128.value_.consume_after._M_dataplus._M_p !=
                          &local_128.value_.consume_after.field_2) {
                        operator_delete(local_128.value_.consume_after._M_dataplus._M_p,
                                        local_128.value_.consume_after.field_2._M_allocated_capacity
                                        + 1);
                      }
                      (*std::__detail::__variant::
                        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                        ::_S_vtable._M_arr
                        [local_128.value_.value.
                         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                         .
                         super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                         .
                         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                         .
                         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                         .
                         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                         .
                         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                         ._M_index]._M_data)
                                ((anon_class_1_0_00000001 *)&local_40,&local_128.value_.value);
                      local_128.value_.value.
                      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                      .
                      super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      ._M_index = 0xff;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
                        operator_delete(local_128.key_._M_dataplus._M_p,
                                        local_128.key_.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                      local_68._M_dataplus._M_p._0_1_) != &local_68.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                                 local_68._M_dataplus._M_p._0_1_),
                                        local_68.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_148._M_dataplus._M_p != &local_148.field_2) {
                        operator_delete(local_148._M_dataplus._M_p,
                                        CONCAT44(local_148.field_2._M_allocated_capacity._4_4_,
                                                 local_148.field_2._M_allocated_capacity._0_4_) + 1)
                        ;
                      }
                    }
                    else {
                      google::protobuf::io::Printer::Emit
                                (p,0,0,0x1f,"\n      if (has_$name$()) {\n    ");
                    }
                    *(long *)(local_1b8._0_8_ + 0x68) =
                         *(long *)(local_1b8._0_8_ + 0x68) + *(long *)(local_1b8._0_8_ + 0x58);
                    pFVar26 = *ppFVar22;
                    bVar7 = true;
                  }
                  pFVar16 = FieldGeneratorTable::get(local_188,pFVar26);
                  FieldGenerator::GenerateMessageClearingCode(pFVar16,p);
                  if (bVar7) {
                    google::protobuf::io::Printer::Outdent();
                    format_05._M_str = "}\n";
                    format_05._M_len = 2;
                    io::Printer::
                    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                              ((Printer *)local_1b8._0_8_,
                               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )ZEXT816(0),
                               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)(local_1b8 + 8),format_05);
                  }
                }
              }
              if ((char)local_1f8 != '\0') {
                google::protobuf::io::Printer::Outdent();
                format_06._M_str = "}\n";
                format_06._M_len = 2;
                io::Printer::
                FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                          ((Printer *)local_1b8._0_8_,
                           (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )ZEXT816(0),
                           (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(local_1b8 + 8),format_06);
              }
              it._M_current = it._M_current + 1;
              uVar21 = (ulong)local_1bc;
            } while (it._M_current != local_178._M_current);
          }
          if ((char)uVar21 != '\0') {
            google::protobuf::io::Printer::Outdent();
            format_07._M_str = "}\n";
            format_07._M_len = 2;
            io::Printer::
            FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                      ((Printer *)local_1b8._0_8_,
                       (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )ZEXT816(0),
                       (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_1b8 + 8),format_07);
          }
          if (local_1f9 != '\0') {
            google::protobuf::io::Printer::Outdent();
            google::protobuf::io::Printer::Emit(p,0,0,0x11,"\n        }\n      ");
            local_200 = -1;
          }
        } while (it._M_current != local_180);
      }
      goto LAB_001ffa11;
    }
  }
  local_168.
  super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.
  super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (FieldChunk *)0x0;
  local_168.
  super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_start = (FieldChunk *)0x0;
  local_200 = -1;
LAB_001ffa11:
  local_1e8._8_8_ = local_1f0->descriptor_;
  local_128.key_._M_dataplus._M_p = local_128.key_._M_dataplus._M_p & 0xffffffff00000000;
  local_1e8._0_4_ = *(undefined4 *)(local_1e8._8_8_ + 0x7c);
  local_128.key_._M_string_length = local_1e8._8_8_;
  while (bVar7 = cpp::operator==((Iterator *)&local_128,(Iterator *)local_1e8), !bVar7) {
    pOVar18 = OneOfRangeImpl::Iterator::operator*((Iterator *)&local_128);
    Formatter::operator()
              ((Formatter *)local_1b8,"clear_$1$();\n",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pOVar18 + 8))
    ;
    local_128.key_._M_dataplus._M_p._0_4_ = (int)local_128.key_._M_dataplus._M_p + 1;
  }
  if (local_1f0->num_weak_fields_ != 0) {
    format_08._M_str = "$weak_field_map$.ClearAll();\n";
    format_08._M_len = 0x1d;
    io::Printer::
    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_1b8._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_1b8 + 8),format_08);
  }
  if ((local_1f0->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_1f0->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    format_09._M_str = "$has_bits$.Clear();\n";
    format_09._M_len = 0x14;
    io::Printer::
    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_1b8._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_1b8 + 8),format_09);
  }
  format_10._M_str = "_internal_metadata_.Clear<$unknown_fields_type$>();\n";
  format_10._M_len = 0x34;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_1b8._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),
             (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_1b8 + 8),format_10);
  google::protobuf::io::Printer::Outdent();
  format_11._M_str = "}\n";
  format_11._M_len = 2;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_1b8._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),
             (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_1b8 + 8),format_11);
  std::
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  ::~vector(&local_168);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_1b8 + 8));
  return;
}

Assistant:

void MessageGenerator::GenerateClear(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(p);

  // The maximum number of bytes we will memset to zero without checking their
  // hasbit to see if a zero-init is necessary.
  const int kMaxUnconditionalPrimitiveBytesClear = 4;

  format(
      "PROTOBUF_NOINLINE void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n");
  format.Indent();

  format("$pbi$::TSanWrite(&_impl_);\n");

  format(
      // TODO: It would be better to avoid emitting this if it is not used,
      // rather than emitting a workaround for the resulting warning.
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  if (descriptor_->extension_range_count() > 0) {
    format("$extensions$.Clear();\n");
  }

  // Collect fields into chunks. Each chunk may have an if() condition that
  // checks all hasbits in the chunk and skips it if none are set.
  int zero_init_bytes = 0;
  for (const auto& field : optimized_order_) {
    if (CanClearByZeroing(field)) {
      zero_init_bytes += EstimateAlignmentSize(field);
    }
  }
  bool merge_zero_init = zero_init_bytes > kMaxUnconditionalPrimitiveBytesClear;
  int chunk_count = 0;

  std::vector<FieldChunk> chunks = CollectFields(
      optimized_order_, options_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        chunk_count++;
        // This predicate guarantees that there is only a single zero-init
        // (memset) per chunk, and if present it will be at the beginning.
        bool same =
            HasByteIndex(a) == HasByteIndex(b) &&
            a->is_repeated() == b->is_repeated() &&
            IsLikelyPresent(a, options_) == IsLikelyPresent(b, options_) &&
            ShouldSplit(a, options_) == ShouldSplit(b, options_) &&
            (CanClearByZeroing(a) == CanClearByZeroing(b) ||
             (CanClearByZeroing(a) && (chunk_count == 1 || merge_zero_init)));
        if (!same) chunk_count = 0;
        return same;
      });

  auto it = chunks.begin();
  auto end = chunks.end();
  int cached_has_word_index = -1;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, MayGroupChunksForHaswordsCheck);
    bool has_haswords_check = MaybeEmitHaswordsCheck(
        it, next, options_, has_bit_indices_, cached_has_word_index, "", p);
    bool has_default_split_check = !it->fields.empty() && it->should_split;
    if (has_default_split_check) {
      // Some fields are cleared without checking has_bit. So we add the
      // condition here to avoid writing to the default split instance.
      format("if (!IsSplitMessageDefault()) {\n");
      format.Indent();
    }
    while (it != next) {
      const std::vector<const FieldDescriptor*>& fields = it->fields;
      bool chunk_is_split = it->should_split;
      ABSL_CHECK_EQ(has_default_split_check, chunk_is_split);

      const FieldDescriptor* memset_start = nullptr;
      const FieldDescriptor* memset_end = nullptr;
      bool saw_non_zero_init = false;

      for (const auto& field : fields) {
        if (CanClearByZeroing(field)) {
          ABSL_CHECK(!saw_non_zero_init);
          if (!memset_start) memset_start = field;
          memset_end = field;
        } else {
          saw_non_zero_init = true;
        }
      }

      // Whether we wrap this chunk in:
      //   if (cached_has_bits & <chunk hasbits) { /* chunk. */ }
      // We can omit the if() for chunk size 1, or if our fields do not have
      // hasbits. I don't understand the rationale for the last part of the
      // condition, but it matches the old logic.
      const bool check_has_byte =
          HasBitIndex(fields.front()) != kNoHasbit && fields.size() > 1 &&
          !IsLikelyPresent(fields.back(), options_) &&
          (memset_end != fields.back() || merge_zero_init);

      if (check_has_byte) {
        // Emit an if() that will let us skip the whole chunk if none are set.
        uint32_t chunk_mask = GenChunkMask(fields, has_bit_indices_);
        std::string chunk_mask_str =
            absl::StrCat(absl::Hex(chunk_mask, absl::kZeroPad8));

        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        ABSL_DCHECK_LE(2, popcnt(chunk_mask));
        ABSL_DCHECK_GE(8, popcnt(chunk_mask));

        if (cached_has_word_index != HasWordIndex(fields.front())) {
          cached_has_word_index = HasWordIndex(fields.front());
          format("cached_has_bits = $has_bits$[$1$];\n", cached_has_word_index);
        }
        format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
        format.Indent();
      }

      if (memset_start) {
        if (memset_start == memset_end) {
          // For clarity, do not memset a single field.
          field_generators_.get(memset_start).GenerateMessageClearingCode(p);
        } else {
          ABSL_CHECK_EQ(chunk_is_split, ShouldSplit(memset_start, options_));
          ABSL_CHECK_EQ(chunk_is_split, ShouldSplit(memset_end, options_));
          format(
              "::memset(&$1$, 0, static_cast<::size_t>(\n"
              "    reinterpret_cast<char*>(&$2$) -\n"
              "    reinterpret_cast<char*>(&$1$)) + sizeof($2$));\n",
              FieldMemberName(memset_start, chunk_is_split),
              FieldMemberName(memset_end, chunk_is_split));
        }
      }

      // Clear all non-zero-initializable fields in the chunk.
      for (const auto& field : fields) {
        if (CanClearByZeroing(field)) continue;
        // It's faster to just overwrite primitive types, but we should only
        // clear strings and messages if they were set.
        //
        // TODO:  Let the CppFieldGenerator decide this somehow.
        bool have_enclosing_if =
            HasBitIndex(field) != kNoHasbit &&
            (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
             field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);

        if (have_enclosing_if) {
          PrintPresenceCheck(field, has_bit_indices_, p,
                             &cached_has_word_index);
          format.Indent();
        }

        field_generators_.get(field).GenerateMessageClearingCode(p);

        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      }

      if (check_has_byte) {
        format.Outdent();
        format("}\n");
      }

      // To next chunk.
      ++it;
    }

    if (has_default_split_check) {
      format.Outdent();
      format("}\n");
    }
    if (has_haswords_check) {
      p->Outdent();
      p->Emit(R"cc(
        }
      )cc");

      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }
  // Step 4: Unions.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("clear_$1$();\n", oneof->name());
  }

  if (num_weak_fields_) {
    format("$weak_field_map$.ClearAll();\n");
  }

  // We don't clear donated status.

  if (!has_bit_indices_.empty()) {
    // Step 5: Everything else.
    format("$has_bits$.Clear();\n");
  }

  format("_internal_metadata_.Clear<$unknown_fields_type$>();\n");

  format.Outdent();
  format("}\n");
}